

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsThermalEngine.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsThermalEngine::ChShaftsThermalEngine(ChShaftsThermalEngine *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChFunction *__tmp;
  
  ChShaftsTorqueBase::ChShaftsTorqueBase(&this->super_ChShaftsTorqueBase);
  (this->super_ChShaftsTorqueBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj
       = (_func_int **)&PTR__ChShaftsThermalEngine_00b4cb00;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->throttle = 1.0;
  this->error_backward = false;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

ChShaftsThermalEngine::ChShaftsThermalEngine() : throttle(1), error_backward(false) {
    // default torque curve= constant zero. User will provide better fx.
    Tw = chrono_types::make_shared<ChFunction_Const>(0);
}